

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_VRR_Writer.cpp
# Opt level: O0

void __thiscall OSTEI_VRR_Writer::WriteVRR_General_(OSTEI_VRR_Writer *this,ostream *os,QAM *am)

{
  bool bVar1;
  RRStepType RVar2;
  int iVar3;
  difference_type dVar4;
  ostream *poVar5;
  int *piVar6;
  reference pvVar7;
  QAM *am_00;
  ostream *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *it_1;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  QAM *it;
  iterator __end1;
  iterator __begin1;
  QAMList *__range1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  amreq_str;
  QAMList amreq;
  StringSet varreq;
  string stepstr;
  RRStepType rrstep;
  undefined1 in_stack_0000086b;
  RRStepType in_stack_0000086c;
  QAM *in_stack_00000870;
  OSTEI_VRR_Algorithm_Base *in_stack_00000878;
  undefined4 in_stack_fffffffffffffb48;
  int in_stack_fffffffffffffb4c;
  OSTEI_VRR_Algorithm_Base *in_stack_fffffffffffffb50;
  ostream *in_stack_fffffffffffffb60;
  int *in_stack_fffffffffffffb68;
  int *in_stack_fffffffffffffb70;
  QAM *in_stack_fffffffffffffb98;
  QAM *in_stack_fffffffffffffbf0;
  OSTEI_VRR_Algorithm_Base *in_stack_fffffffffffffbf8;
  string local_2a0 [32];
  reference local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_278;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_270;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_268;
  string local_230 [84];
  undefined4 local_1dc;
  string local_1d8 [39];
  allocator local_1b1;
  string local_1b0 [80];
  reference local_160;
  QAM *local_158;
  __normal_iterator<QAM_*,_std::vector<QAM,_std::allocator<QAM>_>_> local_150;
  undefined1 *local_148;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_140 [3];
  undefined1 local_f8 [120];
  string local_80 [100];
  RRStepType local_1c;
  ostream *local_10;
  
  local_10 = in_RSI;
  QAM::QAM((QAM *)in_stack_fffffffffffffb50,
           (QAM *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
  RVar2 = OSTEI_VRR_Algorithm_Base::GetRRStep
                    (in_stack_fffffffffffffb50,
                     (QAM *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
  QAM::~QAM((QAM *)0x143af6);
  local_1c = RVar2;
  RRStepTypeToStr_abi_cxx11_((RRStepType)((ulong)in_stack_fffffffffffffb98 >> 0x20));
  QAM::QAM((QAM *)in_stack_fffffffffffffb50,
           (QAM *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
  OSTEI_VRR_Algorithm_Base::GetVarReq_abi_cxx11_
            (in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
  QAM::~QAM((QAM *)0x143b6f);
  QAM::QAM((QAM *)in_stack_fffffffffffffb50,
           (QAM *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
  OSTEI_VRR_Algorithm_Base::GenerateAMReq
            (in_stack_00000878,in_stack_00000870,in_stack_0000086c,(bool)in_stack_0000086b);
  QAM::~QAM((QAM *)0x143bd3);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x143be0);
  local_148 = local_f8;
  local_150._M_current =
       (QAM *)std::vector<QAM,_std::allocator<QAM>_>::begin
                        ((vector<QAM,_std::allocator<QAM>_> *)
                         CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
  local_158 = (QAM *)std::vector<QAM,_std::allocator<QAM>_>::end
                               ((vector<QAM,_std::allocator<QAM>_> *)
                                CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<QAM_*,_std::vector<QAM,_std::allocator<QAM>_>_> *)
                            in_stack_fffffffffffffb50,
                            (__normal_iterator<QAM_*,_std::vector<QAM,_std::allocator<QAM>_>_> *)
                            CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48)), bVar1) {
    local_160 = __gnu_cxx::__normal_iterator<QAM_*,_std::vector<QAM,_std::allocator<QAM>_>_>::
                operator*(&local_150);
    QAM::QAM((QAM *)in_stack_fffffffffffffb50,
             (QAM *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
    bVar1 = ValidQAM((QAM *)in_stack_fffffffffffffb50);
    QAM::~QAM((QAM *)0x143c97);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      PrimVarName_abi_cxx11_(in_stack_fffffffffffffb98);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffb50,
                  (value_type *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
      std::__cxx11::string::~string(local_1d8);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1b0,"NULL",&local_1b1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffb50,
                  (value_type *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
      std::__cxx11::string::~string(local_1b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
    }
    __gnu_cxx::__normal_iterator<QAM_*,_std::vector<QAM,_std::allocator<QAM>_>_>::operator++
              (&local_150);
  }
  QAM::begin((QAM *)0x143ec0);
  QAM::end((QAM *)0x143ed7);
  local_1dc = 0;
  dVar4 = std::count<int*,int>
                    (in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,
                     (int *)in_stack_fffffffffffffb60);
  if (dVar4 == 3) {
    poVar5 = std::operator<<(local_10,(string *)indent5_abi_cxx11_);
    poVar5 = std::operator<<(poVar5,"ostei_general_vrr1_");
    poVar5 = std::operator<<(poVar5,local_80);
    poVar5 = std::operator<<(poVar5,"(");
    piVar6 = QAM::operator[]((QAM *)in_stack_fffffffffffffb50,in_stack_fffffffffffffb4c);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,*piVar6);
    poVar5 = std::operator<<(poVar5,", ");
    QAM::QAM((QAM *)in_stack_fffffffffffffb50,
             (QAM *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
    iVar3 = OSTEI_VRR_Algorithm_Base::GetMReq
                      (in_stack_fffffffffffffb50,
                       (QAM *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar3 + 1);
    poVar5 = std::operator<<(poVar5,",\n");
    std::operator<<(poVar5,(string *)indent7_abi_cxx11_);
    QAM::~QAM((QAM *)0x1440a5);
    if ((local_1c == I) || (local_1c == J)) {
      std::operator<<(local_10,"one_over_2p, a_over_p, aop_PQ, ");
    }
    else {
      std::operator<<(local_10,"one_over_2q, a_over_q, aoq_PQ, ");
    }
    switch(local_1c) {
    case I:
      std::operator<<(local_10,"P_PA,\n");
      poVar5 = std::operator<<(local_10,(string *)indent7_abi_cxx11_);
      pvVar7 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](local_140,0);
      poVar5 = std::operator<<(poVar5,(string *)pvVar7);
      poVar5 = std::operator<<(poVar5,", ");
      pvVar7 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](local_140,1);
      poVar5 = std::operator<<(poVar5,(string *)pvVar7);
      std::operator<<(poVar5,", ");
      break;
    case J:
      std::operator<<(local_10,"P_PB,\n");
      poVar5 = std::operator<<(local_10,(string *)indent7_abi_cxx11_);
      pvVar7 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](local_140,0);
      poVar5 = std::operator<<(poVar5,(string *)pvVar7);
      poVar5 = std::operator<<(poVar5,", ");
      pvVar7 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](local_140,2);
      poVar5 = std::operator<<(poVar5,(string *)pvVar7);
      std::operator<<(poVar5,", ");
      break;
    case K:
      std::operator<<(local_10,"Q_PA,\n");
      poVar5 = std::operator<<(local_10,(string *)indent7_abi_cxx11_);
      pvVar7 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](local_140,0);
      poVar5 = std::operator<<(poVar5,(string *)pvVar7);
      poVar5 = std::operator<<(poVar5,", ");
      pvVar7 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](local_140,1);
      poVar5 = std::operator<<(poVar5,(string *)pvVar7);
      std::operator<<(poVar5,", ");
      break;
    case L:
      std::operator<<(local_10,"Q_PB,\n");
      poVar5 = std::operator<<(local_10,(string *)indent7_abi_cxx11_);
      pvVar7 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](local_140,0);
      poVar5 = std::operator<<(poVar5,(string *)pvVar7);
      poVar5 = std::operator<<(poVar5,", ");
      pvVar7 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](local_140,2);
      poVar5 = std::operator<<(poVar5,(string *)pvVar7);
      std::operator<<(poVar5,", ");
    }
    PrimVarName_abi_cxx11_(in_stack_fffffffffffffb98);
    poVar5 = std::operator<<(local_10,local_230);
    std::operator<<(poVar5,");\n");
    std::__cxx11::string::~string(local_230);
  }
  else {
    poVar5 = std::operator<<(local_10,(string *)indent5_abi_cxx11_);
    poVar5 = std::operator<<(poVar5,"ostei_general_vrr_");
    poVar5 = std::operator<<(poVar5,local_80);
    poVar5 = std::operator<<(poVar5,"(");
    piVar6 = QAM::operator[]((QAM *)in_stack_fffffffffffffb50,in_stack_fffffffffffffb4c);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,*piVar6);
    poVar5 = std::operator<<(poVar5,", ");
    piVar6 = QAM::operator[]((QAM *)in_stack_fffffffffffffb50,in_stack_fffffffffffffb4c);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,*piVar6);
    poVar5 = std::operator<<(poVar5,", ");
    piVar6 = QAM::operator[]((QAM *)in_stack_fffffffffffffb50,in_stack_fffffffffffffb4c);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,*piVar6);
    poVar5 = std::operator<<(poVar5,", ");
    am_00 = (QAM *)QAM::operator[]((QAM *)in_stack_fffffffffffffb50,in_stack_fffffffffffffb4c);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(am_00->qam)._M_elems[0]);
    poVar5 = std::operator<<(poVar5,", ");
    QAM::QAM((QAM *)in_stack_fffffffffffffb50,
             (QAM *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
    iVar3 = OSTEI_VRR_Algorithm_Base::GetMReq
                      (in_stack_fffffffffffffb50,
                       (QAM *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar3 + 1);
    poVar5 = std::operator<<(poVar5,",\n");
    std::operator<<(poVar5,(string *)indent7_abi_cxx11_);
    QAM::~QAM((QAM *)0x144725);
    if ((local_1c == I) || (local_1c == J)) {
      std::operator<<(local_10,"one_over_2p, a_over_p, one_over_2pq, aop_PQ, ");
    }
    else {
      std::operator<<(local_10,"one_over_2q, a_over_q, one_over_2pq, aoq_PQ, ");
    }
    if (local_1c == I) {
      std::operator<<(local_10,"P_PA,\n");
    }
    if (local_1c == J) {
      std::operator<<(local_10,"P_PB,\n");
    }
    if (local_1c == K) {
      std::operator<<(local_10,"Q_PA,\n");
    }
    if (local_1c == L) {
      std::operator<<(local_10,"Q_PB,\n");
    }
    std::operator<<(local_10,(string *)indent7_abi_cxx11_);
    local_268 = local_140;
    local_270._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
    local_278 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_fffffffffffffb50,
                              (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48)),
          bVar1) {
      local_280 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&local_270);
      in_stack_fffffffffffffb60 = std::operator<<(local_10,(string *)local_280);
      std::operator<<(in_stack_fffffffffffffb60,", ");
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_270);
    }
    PrimVarName_abi_cxx11_(am_00);
    poVar5 = std::operator<<(local_10,local_2a0);
    std::operator<<(poVar5,");\n");
    std::__cxx11::string::~string(local_2a0);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffb60);
  std::vector<QAM,_std::allocator<QAM>_>::~vector
            ((vector<QAM,_std::allocator<QAM>_> *)in_stack_fffffffffffffb60);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x144980);
  std::__cxx11::string::~string(local_80);
  return;
}

Assistant:

void OSTEI_VRR_Writer::WriteVRR_General_(std::ostream & os, QAM am) const
{
    // is this a special case (incrementing with all other AM == 0)?
    RRStepType rrstep = vrr_algo_.GetRRStep(am);
    std::string stepstr = RRStepTypeToStr(rrstep);
    auto varreq = vrr_algo_.GetVarReq(am);

    auto amreq = vrr_algo_.GenerateAMReq(am, rrstep, true);
    std::vector<std::string> amreq_str;
    for(const auto &it : amreq)
    {
        if(!ValidQAM(it))
            amreq_str.push_back("NULL");
        else
            amreq_str.push_back(PrimVarName(it));
    }
    

    if(std::count(am.begin(), am.end(), 0) == 3)
    {
        os << indent5 << "ostei_general_vrr1_" << stepstr << "("
                      << am[static_cast<int>(rrstep)] << ", " << (vrr_algo_.GetMReq(am)+1) << ",\n"
           << indent7;

        if(rrstep == RRStepType::I || rrstep == RRStepType::J)
            os << "one_over_2p, a_over_p, aop_PQ, ";
        else
            os << "one_over_2q, a_over_q, aoq_PQ, ";

        switch(rrstep)
        {
            case RRStepType::I:
                os << "P_PA,\n";
                os << indent7 << amreq_str[0] << ", "
                              << amreq_str[1] << ", ";
                break;
        
            case RRStepType::J:
                os << "P_PB,\n";
                os << indent7 << amreq_str[0] << ", "
                              << amreq_str[2] << ", ";
                break;

            case RRStepType::K:
                os << "Q_PA,\n";
                os << indent7 << amreq_str[0] << ", "
                              << amreq_str[1] << ", ";
                break;

            case RRStepType::L:
                os << "Q_PB,\n";
                os << indent7 << amreq_str[0] << ", "
                              << amreq_str[2] << ", ";
                break;
        }

        os << PrimVarName(am) << ");\n"; // output array

    }
    else
    {
        os << indent5 << "ostei_general_vrr_" << stepstr << "("
                      << am[0] << ", " << am[1] << ", " << am[2] << ", " << am[3] << ", " << (vrr_algo_.GetMReq(am)+1) << ",\n"
           << indent7;

        if(rrstep == RRStepType::I || rrstep == RRStepType::J)
            os << "one_over_2p, a_over_p, one_over_2pq, aop_PQ, ";
        else
            os << "one_over_2q, a_over_q, one_over_2pq, aoq_PQ, ";


        if(rrstep == RRStepType::I)
            os << "P_PA,\n";
        if(rrstep == RRStepType::J)
            os << "P_PB,\n";
        if(rrstep == RRStepType::K)
            os << "Q_PA,\n";
        if(rrstep == RRStepType::L)
            os << "Q_PB,\n";

        os << indent7;
        for(const auto &it : amreq_str)
            os << it << ", ";

        os << PrimVarName(am) << ");\n";
    }
}